

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

xxh_u64 XXH64_endian_align(xxh_u8 *input,size_t len,xxh_u64 seed,XXH_alignment align)

{
  xxh_u64 xVar1;
  xxh_u64 local_60;
  xxh_u64 v4;
  xxh_u64 v3;
  xxh_u64 v2;
  xxh_u64 v1;
  xxh_u8 *limit;
  xxh_u8 *bEnd;
  xxh_u64 h64;
  XXH_alignment align_local;
  xxh_u64 seed_local;
  size_t len_local;
  xxh_u8 *input_local;
  
  len_local = (size_t)input;
  if (len < 0x20) {
    bEnd = (xxh_u8 *)(seed + 0x27d4eb2f165667c5);
  }
  else {
    v2 = seed + 0x60ea27eeadc0b5d6;
    v3 = seed + 0xc2b2ae3d27d4eb4f;
    local_60 = seed + 0x61c8864e7a143579;
    v4 = seed;
    do {
      xVar1 = XXH_readLE64_align((void *)len_local,align);
      v2 = XXH64_round(v2,xVar1);
      xVar1 = XXH_readLE64_align((void *)(len_local + 8),align);
      v3 = XXH64_round(v3,xVar1);
      xVar1 = XXH_readLE64_align((void *)(len_local + 0x10),align);
      v4 = XXH64_round(v4,xVar1);
      xVar1 = XXH_readLE64_align((void *)(len_local + 0x18),align);
      local_60 = XXH64_round(local_60,xVar1);
      len_local = len_local + 0x20;
    } while (len_local < input + (len - 0x1f));
    xVar1 = XXH64_mergeRound((v2 << 1 | (ulong)((long)v2 < 0)) + (v3 << 7 | v3 >> 0x39) +
                             (v4 << 0xc | v4 >> 0x34) + (local_60 << 0x12 | local_60 >> 0x2e),v2);
    xVar1 = XXH64_mergeRound(xVar1,v3);
    xVar1 = XXH64_mergeRound(xVar1,v4);
    bEnd = (xxh_u8 *)XXH64_mergeRound(xVar1,local_60);
  }
  xVar1 = XXH64_finalize((xxh_u64)(bEnd + len),(xxh_u8 *)len_local,len,align);
  return xVar1;
}

Assistant:

XXH_FORCE_INLINE xxh_u64
XXH64_endian_align(const xxh_u8* input, size_t len, xxh_u64 seed, XXH_alignment align)
{
    xxh_u64 h64;
    if (input==NULL) XXH_ASSERT(len == 0);

    if (len>=32) {
        const xxh_u8* const bEnd = input + len;
        const xxh_u8* const limit = bEnd - 31;
        xxh_u64 v1 = seed + XXH_PRIME64_1 + XXH_PRIME64_2;
        xxh_u64 v2 = seed + XXH_PRIME64_2;
        xxh_u64 v3 = seed + 0;
        xxh_u64 v4 = seed - XXH_PRIME64_1;

        do {
            v1 = XXH64_round(v1, XXH_get64bits(input)); input+=8;
            v2 = XXH64_round(v2, XXH_get64bits(input)); input+=8;
            v3 = XXH64_round(v3, XXH_get64bits(input)); input+=8;
            v4 = XXH64_round(v4, XXH_get64bits(input)); input+=8;
        } while (input<limit);

        h64 = XXH_rotl64(v1, 1) + XXH_rotl64(v2, 7) + XXH_rotl64(v3, 12) + XXH_rotl64(v4, 18);
        h64 = XXH64_mergeRound(h64, v1);
        h64 = XXH64_mergeRound(h64, v2);
        h64 = XXH64_mergeRound(h64, v3);
        h64 = XXH64_mergeRound(h64, v4);

    } else {
        h64  = seed + XXH_PRIME64_5;
    }

    h64 += (xxh_u64) len;

    return XXH64_finalize(h64, input, len, align);
}